

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

float64 * gauden_scale_densities_fwd
                    (float64 ***den,uint32 ***den_idx,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  float64 *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  if (g->n_top <= g->n_density) {
    pfVar3 = (float64 *)
             __ckd_calloc__((ulong)g->n_feat,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x50b);
    uVar5 = (ulong)g->n_feat;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pfVar3[uVar4] = -1.8e+307;
    }
    for (uVar4 = 0; uVar4 != n_cb; uVar4 = uVar4 + 1) {
      uVar1 = cb[uVar4];
      for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        uVar2 = g->n_top;
        for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
          dVar8 = (double)den[uVar1][uVar6][uVar7];
          if ((double)pfVar3[uVar6] <= dVar8 && dVar8 != (double)pfVar3[uVar6]) {
            pfVar3[uVar6] = (float64)dVar8;
          }
        }
      }
    }
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pfVar3[uVar4] = (float64)((double)pfVar3[uVar4] + -10.0);
    }
    for (uVar4 = 0; uVar4 != n_cb; uVar4 = uVar4 + 1) {
      uVar1 = cb[uVar4];
      for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
        for (uVar5 = 0; uVar5 < g->n_top; uVar5 = uVar5 + 1) {
          dVar8 = exp((double)den[uVar1][uVar6][uVar5] - (double)pfVar3[uVar6]);
          den[uVar1][uVar6][uVar5] = (float64)dVar8;
        }
        uVar5 = (ulong)g->n_feat;
      }
    }
    return pfVar3;
  }
  __assert_fail("g->n_top <= g->n_density",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x509,
                "float64 *gauden_scale_densities_fwd(float64 ***, uint32 ***, uint32 *, uint32, gauden_t *)"
               );
}

Assistant:

float64 *
gauden_scale_densities_fwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *max_den;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    max_den = ckd_calloc(g->n_feat, sizeof(float64));

    /* Initialize max_den to some value in the domain */
    for (j = 0; j < g->n_feat; j++) {
	max_den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
    }

    /* Find the max for each feature */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		if (max_den[j] < den[c][j][k]) {
		    max_den[j] = den[c][j][k];
		}
	    }
	}
    }

    for (j = 0; j < g->n_feat; j++) {
	max_den[j] -= MAX_LOG_DEN;
    }
    
    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - max_den[j]);
	    }
	}
    }

    return max_den;
}